

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002612d8;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
  super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>.impl_.value_ =
       (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
          super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
          super_MatcherBase<fmt::BasicStringRef<char>_>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
               super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
               _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_>.impl_ + 8);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
  super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0025ea00;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}